

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O0

void helicsFederateInfoSetCoreTypeFromString
               (HelicsFederateInfo fedInfo,char *coretype,HelicsError *err)

{
  string_view newError;
  element_type *__lhs;
  char *pcVar1;
  undefined4 *in_RDX;
  long in_RSI;
  string_view in_stack_00000030;
  CoreType ctype;
  FederateInfo *info;
  HelicsError *in_stack_ffffffffffffff30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  char *in_stack_ffffffffffffff38;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff40;
  MasterObjectHolder *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  CoreType local_24;
  FederateInfo *local_20;
  undefined4 *local_18;
  long local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_20 = getFedInfo(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  if (local_20 != (FederateInfo *)0x0) {
    if (local_10 == 0) {
      local_20->coreType = DEFAULT;
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      local_24 = helics::core::coreTypeFromString(in_stack_00000030);
      if ((local_24 == UNRECOGNIZED) && (local_18 != (undefined4 *)0x0)) {
        *local_18 = 0xfffffffc;
        this = &local_48;
        getMasterHolder();
        __lhs = std::
                __shared_ptr_access<MasterObjectHolder,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<MasterObjectHolder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1b8593);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                   (allocator<char> *)in_stack_ffffffffffffff60);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                       (char *)this);
        std::__cxx11::string::operator_cast_to_basic_string_view(this);
        newError._M_str = (char *)in_stack_ffffffffffffff70;
        newError._M_len = (size_t)in_stack_ffffffffffffff68;
        pcVar1 = MasterObjectHolder::addErrorString(in_stack_ffffffffffffff60,newError);
        *(char **)(local_18 + 2) = pcVar1;
        std::__cxx11::string::~string(this);
        std::__cxx11::string::~string(this);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff67);
        std::shared_ptr<MasterObjectHolder>::~shared_ptr((shared_ptr<MasterObjectHolder> *)0x1b8657)
        ;
      }
      else {
        local_20->coreType = local_24;
      }
    }
  }
  return;
}

Assistant:

void helicsFederateInfoSetCoreTypeFromString(HelicsFederateInfo fedInfo, const char* coretype, HelicsError* err)
{
    auto* info = getFedInfo(fedInfo, err);
    if (info == nullptr) {
        return;
    }
    if (coretype == nullptr) {
        info->coreType = helics::CoreType::DEFAULT;
        return;
    }
    auto ctype = helics::core::coreTypeFromString(coretype);
    if (ctype == helics::CoreType::UNRECOGNIZED) {
        if (err != nullptr) {
            err->error_code = HELICS_ERROR_INVALID_ARGUMENT;
            err->message = getMasterHolder()->addErrorString(std::string(coretype) + " is not a valid core type");
            return;
        }
    }
    info->coreType = ctype;
}